

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intContain.c
# Opt level: O1

int Inter_ManCheckEquivalence(Aig_Man_t *pNew,Aig_Man_t *pOld)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Man_t *p_00;
  
  p = Aig_ManCreateMiter(pNew,pOld,0);
  iVar1 = Fra_FraigMiterStatus(p);
  if (iVar1 == -1) {
    p_00 = Fra_FraigEquivence(p,1000000,1);
    iVar1 = Fra_FraigMiterStatus(p_00);
    Aig_ManStop(p_00);
  }
  if (iVar1 != -1) {
    Aig_ManStop(p);
    return iVar1;
  }
  __assert_fail("RetValue != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/int/intContain.c"
                ,0x5d,"int Inter_ManCheckEquivalence(Aig_Man_t *, Aig_Man_t *)");
}

Assistant:

int Inter_ManCheckEquivalence( Aig_Man_t * pNew, Aig_Man_t * pOld )
{
    Aig_Man_t * pMiter, * pAigTemp;
    int RetValue;
    pMiter = Aig_ManCreateMiter( pNew, pOld, 0 );
//    pMiter = Dar_ManRwsat( pAigTemp = pMiter, 1, 0 );
//    Aig_ManStop( pAigTemp );
    RetValue = Fra_FraigMiterStatus( pMiter );
    if ( RetValue == -1 )
    {
        pAigTemp = Fra_FraigEquivence( pMiter, 1000000, 1 );
        RetValue = Fra_FraigMiterStatus( pAigTemp );
        Aig_ManStop( pAigTemp );
//        RetValue = Fra_FraigSat( pMiter, 1000000, 0, 0, 0, 0, 0, 0 );
    }
    assert( RetValue != -1 );
    Aig_ManStop( pMiter );
    return RetValue;
}